

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

uint8_t winmd::reader::database::
        composite_index_size<winmd::reader::table<winmd::reader::TypeDef>,winmd::reader::table<winmd::reader::MethodDef>,winmd::reader::table<winmd::reader::Assembly>>
                  (table<winmd::reader::TypeDef> *tables,table<winmd::reader::MethodDef> *tables_1,
                  table<winmd::reader::Assembly> *tables_2)

{
  uint uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  
  uVar1 = (tables->super_table_base).m_row_count;
  uVar2 = impl::bits_needed(3);
  uVar3 = '\x04';
  if (uVar1 >> (0x10 - uVar2 & 0x3f) == 0) {
    uVar1 = (tables_1->super_table_base).m_row_count;
    uVar2 = impl::bits_needed(3);
    if (uVar1 >> (0x10 - uVar2 & 0x3f) == 0) {
      uVar1 = (tables_2->super_table_base).m_row_count;
      uVar2 = impl::bits_needed(3);
      uVar3 = (uVar1 >> (0x10 - uVar2 & 0x3f) != 0) * '\x02' + '\x02';
    }
  }
  return uVar3;
}

Assistant:

static uint8_t composite_index_size(Tables const&... tables)
        {
            return (composite_index_size(tables.size(), impl::bits_needed(sizeof...(tables))) && ...) ? 2 : 4;
        }